

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O3

void __thiscall
validation_chainstatemanager_tests::chainstatemanager::test_method(chainstatemanager *this)

{
  long lVar1;
  ChainstateManager *this_00;
  __uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> _Var2;
  pointer ppCVar3;
  uint256 *puVar4;
  uint256 base_blockhash;
  path leveldb_name;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  readonly_property<bool> rVar13;
  Chainstate *pCVar14;
  Chainstate *pCVar15;
  CCoinsViewCache *this_01;
  Chainstate *pCVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> line_num;
  byte bVar17;
  iterator in_R8;
  iterator pvVar18;
  path *ppVar19;
  iterator in_R9;
  iterator pvVar20;
  CBlockIndex *pCVar21;
  int iVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  shared_ptr<const_CBlock> pblock;
  undefined4 uVar25;
  undefined4 uVar26;
  check_type cVar27;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa98;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffaa8;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  CBlockIndex *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  CBlockIndex *active_tip2;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  pointer local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  assertion_result local_388;
  char *local_370;
  _Base_ptr local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 local_338 [24];
  undefined1 local_320 [16];
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  pointer local_2e8;
  char *local_2e0;
  pointer local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  CBlockIndex *exp_tip;
  CBlockIndex *active_tip;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  CTxMemPool *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  pointer local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  assertion_result local_168;
  char *local_150;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all2;
  undefined1 local_130 [8];
  assertion_result local_128;
  assertion_result *local_110;
  CChain *local_108;
  element_type *local_100;
  shared_count local_f8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  shared_count asStack_e0 [2];
  bool local_d0;
  BlockValidationState _;
  path local_80;
  uint256 snapshot_blockhash;
  
  local_168.m_message.pn.pi_ = (sp_counted_base *)local_168.m_message.px;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman._M_t.
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2d;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  _cVar27 = 0x75e75c;
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&_,this_00);
  local_128._0_8_ =
       CONCAT71(local_128._1_7_,
                _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf
                [8]) ^ 1;
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  asStack_e0[1].pi_ = (sp_counted_base *)&local_168;
  local_168._0_8_ = "!manager.SnapshotBlockhash().has_value()";
  local_168.m_message.px = (element_type *)0xf54b79;
  criticalblock19.super_unique_lock._8_8_ = stack0xffffffffffffff19 << 8;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b0 = "";
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_128,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar27,(size_t)&local_1b8,0x2d);
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  pCVar14 = ChainstateManager::ActiveChainstate(this_00);
  _.super_ValidationState<BlockValidationResult>._0_8_ = pCVar14;
  std::vector<Chainstate*,std::allocator<Chainstate*>>::emplace_back<Chainstate*>
            ((vector<Chainstate*,std::allocator<Chainstate*>> *)&chainstates,(Chainstate **)&_);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x34;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar20;
  msg_00.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  _cVar27 = 0x75e860;
  bVar12 = ChainstateManager::IsSnapshotActive(this_00);
  criticalblock19.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,!bVar12);
  criticalblock19.super_unique_lock._8_8_ = (element_type *)0x0;
  asStack_e0[0].pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!manager.IsSnapshotActive()";
  local_128.m_message.px = (element_type *)0xf54b95;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01389048;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1e0 = "";
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&_,1,0,WARN,_cVar27,
             (size_t)&local_1e8,0x34);
  boost::detail::shared_count::~shared_count(asStack_e0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x35;
  file_01.m_begin = (iterator)&local_1f8;
  msg_01.m_end = pvVar20;
  msg_01.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_208,
             msg_01);
  _.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&_);
  bVar17 = 1;
  if (((this_00->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
     (_Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           *(tuple<Chainstate_*,_std::default_delete<Chainstate>_> *)
            &(this_00->m_ibd_chainstate)._M_t,
     (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
     _Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
     super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)) {
    bVar17 = *(byte *)((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x38) ^ 1;
  }
  _cVar27 = 0x75e967;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  criticalblock19.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,bVar17);
  criticalblock19.super_unique_lock._8_8_ = (element_type *)0x0;
  asStack_e0[0].pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "(MaybeCheckNotHeld(::cs_main), [&]() -> decltype(auto) { UniqueLock criticalblock14(MaybeCheckNotHeld(::cs_main), \"::cs_main\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 53); return !manager.IsSnapshotValidated(); }())"
  ;
  local_128.m_message.px = (element_type *)0xf54cc4;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01389048;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_210 = "";
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&_,1,0,WARN,_cVar27,
             (size_t)&local_218,0x35);
  boost::detail::shared_count::~shared_count(asStack_e0);
  ChainstateManager::GetAll(&all,this_00);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_238 = "";
  local_250 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x37;
  file_02.m_begin = (iterator)&local_240;
  msg_02.m_end = pvVar20;
  msg_02.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_250,
             msg_02);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)&criticalblock19,(equal_coll_impl *)&local_128,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01388f08;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_258 = "";
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&_,1,0xd,4,0xf54cc5,
             (size_t)&local_260,0x37,"all.end()","chainstates.begin()",0xf54cef);
  boost::detail::shared_count::~shared_count(asStack_e0);
  _.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&_);
  pCVar15 = ChainstateManager::ActiveChainstate(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_268 = "";
  local_280 = (CTxMemPool *)&boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x3a;
  file_03.m_begin = (iterator)&local_270;
  msg_03.m_end = pvVar20;
  msg_03.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_280,
             msg_03);
  local_100 = (element_type *)&pCVar15->m_chain;
  local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_110 = (assertion_result *)0xf4aea1;
  local_108 = &pCVar14->m_chain;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_108;
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e215e9;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&local_388;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_0138eaf0;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0138eaf0;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0x2;
  local_388._0_8_ = &local_100;
  asStack_e0[1].pi_ = (sp_counted_base *)&all2;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar15 == pCVar14);
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_128,1,2,REQUIRE,0xf54d01,(size_t)&snapshot_blockhash,
             0x3a,(unique_lock<std::recursive_mutex> *)&_,"&c1.m_chain",(int)&criticalblock19);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,10);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3e;
  file_04.m_begin = (iterator)&local_290;
  msg_04.m_end = pvVar20;
  msg_04.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2a0,
             msg_04);
  local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_110 = (assertion_result *)0xf4aea1;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&_);
  pCVar15 = ChainstateManager::ActiveChainstate(this_00);
  iVar22 = (int)((ulong)((long)(pCVar15->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar15->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  local_100 = (element_type *)CONCAT44(local_100._4_4_,iVar22);
  local_108 = (CChain *)CONCAT44(local_108._4_4_,0x6e);
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar22 == 0x6e);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e215e9;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013890c8;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&local_388;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_108;
  criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013890c8;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0x2;
  local_388._0_8_ = &local_100;
  asStack_e0[1].pi_ = (sp_counted_base *)&all2;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_128,1,2,REQUIRE,0xf54d1b,(size_t)&snapshot_blockhash,
             0x3e,(unique_lock<std::recursive_mutex> *)&_,"110",(int)&criticalblock19);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  _.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&_);
  pCVar15 = ChainstateManager::ActiveChainstate(this_00);
  ppCVar3 = (pCVar15->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar15->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar21 = (CBlockIndex *)0x0;
  }
  else {
    pCVar21 = ppCVar3[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
  ppCVar3 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    exp_tip = (CBlockIndex *)0x0;
  }
  else {
    exp_tip = ppCVar3[-1];
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x41;
  file_05.m_begin = (iterator)&local_2c0;
  msg_05.m_end = pvVar20;
  msg_05.m_begin = pvVar18;
  active_tip = pCVar21;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2d0,
             msg_05);
  local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_110 = (assertion_result *)0xf4aea1;
  local_388._0_8_ = &active_tip;
  all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&exp_tip;
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(active_tip == exp_tip);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1e215e9;
  snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  _.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_01389e10;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&local_388;
  criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389e10;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar18 = (iterator)0x1;
  pvVar20 = (iterator)0x2;
  asStack_e0[1].pi_ = (sp_counted_base *)&all2;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,(lazy_ostream *)&local_128,1,2,REQUIRE,0xf54e61,(size_t)&snapshot_blockhash,
             0x41,(unique_lock<std::recursive_mutex> *)&_,"exp_tip",(int)&criticalblock19);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d8 = (pointer)0xf54b3e;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x43;
  file_06.m_begin = (iterator)&local_2e0;
  msg_06.m_end = pvVar20;
  msg_06.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f0,
             msg_06);
  _cVar27 = 0x75f052;
  ChainstateManager::SnapshotBlockhash((optional<uint256> *)&_,this_00);
  local_128._0_8_ =
       CONCAT71(local_128._1_7_,
                _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf
                [8]) ^ 1;
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168._0_8_ = "!manager.SnapshotBlockhash().has_value()";
  local_168.m_message.px = (element_type *)0xf54b79;
  criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
  asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  asStack_e0[1].pi_ = (sp_counted_base *)&local_168;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2f8 = "";
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_128,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar27,(size_t)&local_300,0x43);
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  puVar4 = active_tip->phashBlock;
  if (puVar4 != (uint256 *)0x0) {
    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
    snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
    _.super_ValidationState<BlockValidationResult>._0_8_ = &cs_main;
    _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&_);
    uVar25 = snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._16_4_;
    uVar26 = snapshot_blockhash.super_base_blob<256U>.m_data._M_elems._20_4_;
    base_blockhash.super_base_blob<256U>.m_data._M_elems[8] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[9] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[10] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[1] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[1];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[2] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[2];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[3] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[3];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[4] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[4];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[5] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[5];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[6] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[6];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[7] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[7];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)uVar25;
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((uint)uVar25 >> 8);
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((uint)uVar25 >> 0x10);
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((uint)uVar25 >> 0x18);
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = (char)uVar26;
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((uint)uVar26 >> 8);
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((uint)uVar26 >> 0x10);
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((uint)uVar26 >> 0x18);
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
    pCVar15 = ChainstateManager::ActivateExistingSnapshot(this_00,base_blockhash);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&_);
    _.super_ValidationState<BlockValidationResult>._0_8_ = pCVar15;
    std::vector<Chainstate*,std::allocator<Chainstate*>>::emplace_back<Chainstate*>
              ((vector<Chainstate*,std::allocator<Chainstate*>> *)&chainstates,(Chainstate **)&_);
    _.super_ValidationState<BlockValidationResult>._0_8_ =
         (long)"Ensure we can mine blocks on top of the \"new\" IBD chainstate" + 0x32;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_80,(char **)&_,auto_format);
    ppVar19 = &local_80;
    leveldb_name.super_path._M_pathname._M_string_length = (size_type)pCVar14;
    leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa88;
    leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffa98;
    leveldb_name.super_path._M_pathname.field_2._8_8_ = this;
    leveldb_name.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )in_stack_fffffffffffffaa8._M_head_impl;
    Chainstate::InitCoinsDB(pCVar15,0x800000,true,false,leveldb_name);
    std::filesystem::__cxx11::path::~path(&local_80);
    criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    auVar5[0xf] = 0;
    auVar5._0_15_ = stack0xffffffffffffff19;
    stack0xffffffffffffff18 = auVar5 << 8;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
    Chainstate::InitCoinsCache(pCVar15,0x800000);
    this_01 = Chainstate::CoinsTip(pCVar15);
    puVar4 = active_tip->phashBlock;
    if (puVar4 != (uint256 *)0x0) {
      _.super_ValidationState<BlockValidationResult>._0_8_ =
           *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
      _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           *(pointer *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
      _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           *(size_type *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
      _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
           *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
      CCoinsViewCache::SetBestBlock(this_01,(uint256 *)&_);
      puVar4 = active_tip->phashBlock;
      if (puVar4 != (uint256 *)0x0) {
        _.super_ValidationState<BlockValidationResult>._0_8_ =
             *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
        _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             *(pointer *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
        _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
             *(size_type *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
        _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
             = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
        local_128._0_8_ = ::node::BlockManager::LookupBlockIndex(&this_00->m_blockman,(uint256 *)&_)
        ;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                    *)&pCVar15->setBlockIndexCandidates,(CBlockIndex **)&local_128);
        Chainstate::LoadChainTip(pCVar15);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
        _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)&_.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
        _.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
        _.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
        _.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
        _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
             = _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
               _M_allocated_capacity & 0xffffffffffffff00;
        _.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)&_.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
        _.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
        _.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
             '\0';
        local_310 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
        ;
        local_308 = "";
        line_num._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320;
        local_320._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
        local_320._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0x54;
        file_07.m_begin = (iterator)&local_310;
        msg_07.m_end = pvVar18;
        msg_07.m_begin = (iterator)ppVar19;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                   (size_t)line_num._M_pi,msg_07);
        local_338._0_16_ = (undefined1  [16])0x0;
        _cVar27 = 0x75f33d;
        pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             line_num._M_pi;
        pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_338;
        bVar12 = Chainstate::ActivateBestChain(pCVar15,&_,pblock);
        local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar12;
        local_128.m_message.px = (element_type *)0x0;
        local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_168._0_8_ = "c2.ActivateBestChain(_, nullptr)";
        local_168.m_message.px = (element_type *)0xf54e94;
        criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
        criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
        asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        asStack_e0[1].pi_ = (sp_counted_base *)&local_168;
        local_348 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
        ;
        local_340 = "";
        pvVar18 = (iterator)0x1;
        pvVar20 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_128,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar27,(size_t)&local_348,
                   0x54);
        boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
        }
        local_358 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
        ;
        local_350 = "";
        local_368 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        local_360 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0x56;
        file_08.m_begin = (iterator)&local_358;
        msg_08.m_end = pvVar20;
        msg_08.m_begin = pvVar18;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_368
                   ,msg_08);
        local_388.m_message.px = (element_type *)(local_388.m_message._1_8_ << 8);
        local_388._0_8_ = &PTR__lazy_ostream_01388f08;
        local_388.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_370 = "";
        ChainstateManager::SnapshotBlockhash((optional<uint256> *)&criticalblock19,this_00);
        if (local_d0 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          auVar24[0] = -(asStack_e0[0].pi_._0_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x10]);
          auVar24[1] = -(asStack_e0[0].pi_._1_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x11]);
          auVar24[2] = -(asStack_e0[0].pi_._2_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x12]);
          auVar24[3] = -(asStack_e0[0].pi_._3_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x13]);
          auVar24[4] = -(asStack_e0[0].pi_._4_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x14]);
          auVar24[5] = -(asStack_e0[0].pi_._5_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x15]);
          auVar24[6] = -(asStack_e0[0].pi_._6_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x16]);
          auVar24[7] = -(asStack_e0[0].pi_._7_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x17]);
          auVar24[8] = -(asStack_e0[1].pi_._0_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x18]);
          auVar24[9] = -(asStack_e0[1].pi_._1_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x19]);
          auVar24[10] = -(asStack_e0[1].pi_._2_1_ ==
                         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a]);
          auVar24[0xb] = -(asStack_e0[1].pi_._3_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b]);
          auVar24[0xc] = -(asStack_e0[1].pi_._4_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c]);
          auVar24[0xd] = -(asStack_e0[1].pi_._5_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d]);
          auVar24[0xe] = -(asStack_e0[1].pi_._6_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e]);
          auVar24[0xf] = -(asStack_e0[1].pi_._7_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f]);
          auVar23[0] = -((uchar)criticalblock19.super_unique_lock._M_device ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0]);
          auVar23[1] = -(criticalblock19.super_unique_lock._M_device._1_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[1]);
          auVar23[2] = -(criticalblock19.super_unique_lock._M_device._2_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[2]);
          auVar23[3] = -(criticalblock19.super_unique_lock._M_device._3_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[3]);
          auVar23[4] = -(criticalblock19.super_unique_lock._M_device._4_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[4]);
          auVar23[5] = -(criticalblock19.super_unique_lock._M_device._5_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[5]);
          auVar23[6] = -(criticalblock19.super_unique_lock._M_device._6_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[6]);
          auVar23[7] = -(criticalblock19.super_unique_lock._M_device._7_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[7]);
          auVar23[8] = -(criticalblock19.super_unique_lock._M_owns ==
                        (bool)snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[8]);
          auVar23[9] = -(criticalblock19.super_unique_lock._9_1_ ==
                        snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[9]);
          auVar23[10] = -(criticalblock19.super_unique_lock._10_1_ ==
                         snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[10]);
          auVar23[0xb] = -(criticalblock19.super_unique_lock._11_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xb]);
          auVar23[0xc] = -(criticalblock19.super_unique_lock._12_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xc]);
          auVar23[0xd] = -(criticalblock19.super_unique_lock._13_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xd]);
          auVar23[0xe] = -(criticalblock19.super_unique_lock._14_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xe]);
          auVar23[0xf] = -(criticalblock19.super_unique_lock._15_1_ ==
                          snapshot_blockhash.super_base_blob<256U>.m_data._M_elems[0xf]);
          auVar23 = auVar23 & auVar24;
          all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(all2.
                                 super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
          all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_01389a00;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)&local_108;
          local_150 = local_130;
          local_130 = (undefined1  [8])&snapshot_blockhash;
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01389a00;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_108 = (CChain *)&criticalblock19;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&all2,(lazy_ostream *)&local_388,1,2,REQUIRE,0xf54e95,
                     (size_t)&local_100,0x56,&local_128,"snapshot_blockhash",(int)&local_168);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          local_398 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_390 = "";
          local_3a8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_09.m_end = (iterator)0x57;
          file_09.m_begin = (iterator)&local_398;
          msg_09.m_end = pvVar20;
          msg_09.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                     (size_t)&local_3a8,msg_09);
          _cVar27 = 0x75f5d6;
          rVar13.super_class_property<bool>.value =
               (class_property<bool>)ChainstateManager::IsSnapshotActive(this_00);
          local_128.m_message.px = (element_type *)0x0;
          local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_168._0_8_ = "manager.IsSnapshotActive()";
          local_168.m_message.px = (element_type *)0xf54b95;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_168;
          local_3b8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_3b0 = "";
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)rVar13.super_class_property<bool>.value;
          boost::test_tools::tt_detail::report_assertion
                    (&local_128,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar27,(size_t)&local_3b8
                     ,0x57);
          boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
          local_3c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_3c0 = "";
          local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_10.m_end = &DAT_00000058;
          file_10.m_begin = (iterator)&local_3c8;
          msg_10.m_end = pvVar20;
          msg_10.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                     (size_t)&local_3d8,msg_10);
          criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          auVar6[0xf] = 0;
          auVar6._0_15_ = stack0xffffffffffffff19;
          stack0xffffffffffffff18 = auVar6 << 8;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
          rVar13.super_class_property<bool>.value = (class_property<bool>)true;
          if (((this_00->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
             (_Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
              super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
                   *(tuple<Chainstate_*,_std::default_delete<Chainstate>_> *)
                    &(this_00->m_ibd_chainstate)._M_t,
             (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
             _Var2._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0)) {
            rVar13.super_class_property<bool>.value =
                 (class_property<bool>)
                 (*(byte *)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                  .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x38) ^
                 1);
          }
          _cVar27 = 0x75f6ea;
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
          local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)rVar13.super_class_property<bool>.value;
          local_128.m_message.px = (element_type *)0x0;
          local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_168._0_8_ =
               "(MaybeCheckNotHeld(::cs_main), [&]() -> decltype(auto) { UniqueLock criticalblock20(MaybeCheckNotHeld(::cs_main), \"::cs_main\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 88); return !manager.IsSnapshotValidated(); }())"
          ;
          local_168.m_message.px = (element_type *)0xf54fe7;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_168;
          local_3e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_3e0 = "";
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_128,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar27,(size_t)&local_3e8
                     ,0x58);
          boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
          local_3f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_3f0 = "";
          local_408 = &boost::unit_test::basic_cstring<char_const>::null;
          local_400 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0x59;
          file_11.m_begin = (iterator)&local_3f8;
          msg_11.m_end = pvVar20;
          msg_11.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_408,msg_11);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          local_130 = (undefined1  [8])pCVar15;
          active_tip2 = (CBlockIndex *)ChainstateManager::ActiveChainstate(this_00);
          local_108 = (CChain *)&active_tip2;
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1e215e9;
          all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0xf54b3e;
          local_100 = (element_type *)local_130;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0138eb30;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_100;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_0138eb30;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)&local_108;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)(local_130 == (undefined1  [8])active_tip2);
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf54fe8,(size_t)&all2,0x59,
                     (lazy_ostream *)&criticalblock19,"&manager.ActiveChainstate()",(int)&local_128)
          ;
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          local_420 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_418 = "";
          local_430 = &boost::unit_test::basic_cstring<char_const>::null;
          local_428 = &boost::unit_test::basic_cstring<char_const>::null;
          file_12.m_end = (iterator)0x5a;
          file_12.m_begin = (iterator)&local_420;
          msg_12.m_end = pvVar20;
          msg_12.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_430,msg_12);
          _cVar27 = 0x75f953;
          pCVar16 = ChainstateManager::ActiveChainstate(this_00);
          local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(pCVar14 != pCVar16);
          local_128.m_message.px = (element_type *)0x0;
          local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_168._0_8_ = "&c1 != &manager.ActiveChainstate()";
          local_168.m_message.px = (element_type *)0xf5500e;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_440 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_438 = "";
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_168;
          boost::test_tools::tt_detail::report_assertion
                    (&local_128,(lazy_ostream *)&criticalblock19,1,0,WARN,_cVar27,(size_t)&local_440
                     ,0x5a);
          boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
          ChainstateManager::GetAll(&all2,this_00);
          local_450 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_448 = "";
          local_460 = &boost::unit_test::basic_cstring<char_const>::null;
          local_458 = &boost::unit_test::basic_cstring<char_const>::null;
          file_13.m_end = (iterator)0x5c;
          file_13.m_begin = (iterator)&local_450;
          msg_13.m_end = pvVar20;
          msg_13.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                     (size_t)&local_460,msg_13);
          boost::test_tools::tt_detail::equal_coll_impl::operator()
                    (&local_128,(equal_coll_impl *)&local_168,
                     (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      )all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      )all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                     (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      )chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)0xf4aea1;
          local_470 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_468 = "";
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0xd;
          boost::test_tools::tt_detail::report_assertion
                    (&local_128,(lazy_ostream *)&criticalblock19,1,0xd,4,0xf5500f,(size_t)&local_470
                     ,0x5c,"all2.end()","chainstates.begin()",0xf54cef);
          boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
          criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          auVar7[0xf] = 0;
          auVar7._0_15_ = stack0xffffffffffffff19;
          stack0xffffffffffffff18 = auVar7 << 8;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
          pCVar16 = ChainstateManager::ActiveChainstate(this_00);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
          local_480 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_478 = "";
          local_490 = &boost::unit_test::basic_cstring<char_const>::null;
          local_488 = &boost::unit_test::basic_cstring<char_const>::null;
          file_14.m_end = (iterator)0x5f;
          file_14.m_begin = (iterator)&local_480;
          msg_14.m_end = pvVar20;
          msg_14.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_490,msg_14);
          active_tip2 = (CBlockIndex *)&pCVar16->m_chain;
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          local_498 = (CBlockIndex *)&pCVar15->m_chain;
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(pCVar16 == pCVar15);
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip2;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0138eaf0;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_0138eaf0;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          uVar25 = SUB84(&local_128,0);
          local_130 = (undefined1  [8])&local_498;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf55027,(size_t)&local_100,
                     0x5f,&criticalblock19.super_unique_lock,"&c2.m_chain",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          local_4a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_4a0 = "";
          local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_15.m_end = (iterator)0x61;
          file_15.m_begin = (iterator)&local_4a8;
          msg_15.m_end = pvVar20;
          msg_15.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_4b8,msg_15);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          auVar8[0xf] = 0;
          auVar8._0_15_ = stack0xffffffffffffff19;
          stack0xffffffffffffff18 = auVar8 << 8;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
          pCVar16 = ChainstateManager::ActiveChainstate(this_00);
          iVar22 = (int)((ulong)((long)(pCVar16->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar16->m_chain).vChain.
                                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
          active_tip2 = (CBlockIndex *)CONCAT44(active_tip2._4_4_,iVar22);
          local_498._0_4_ = 0x6e;
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar22 == 0x6e);
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip2;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013890c8;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_013890c8;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_130 = (undefined1  [8])&local_498;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf55042,(size_t)&local_100,
                     0x61,&criticalblock19.super_unique_lock,"110",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,1);
          local_4c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_4c0 = "";
          local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_16.m_end = (iterator)0x63;
          file_16.m_begin = (iterator)&local_4c8;
          msg_16.m_end = pvVar20;
          msg_16.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_4d8,msg_16);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          auVar9[0xf] = 0;
          auVar9._0_15_ = stack0xffffffffffffff19;
          stack0xffffffffffffff18 = auVar9 << 8;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
          pCVar16 = ChainstateManager::ActiveChainstate(this_00);
          iVar22 = (int)((ulong)((long)(pCVar16->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar16->m_chain).vChain.
                                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
          active_tip2 = (CBlockIndex *)CONCAT44(active_tip2._4_4_,iVar22);
          local_498._0_4_ = 0x6f;
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar22 == 0x6f);
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip2;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013890c8;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_013890c8;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_130 = (undefined1  [8])&local_498;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf55184,(size_t)&local_100,
                     99,&criticalblock19.super_unique_lock,"111",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          local_4e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_4e0 = "";
          local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_17.m_end = (iterator)0x64;
          file_17.m_begin = (iterator)&local_4e8;
          msg_17.m_end = pvVar20;
          msg_17.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                     (size_t)&local_4f8,msg_17);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          auVar10[0xf] = 0;
          auVar10._0_15_ = stack0xffffffffffffff19;
          stack0xffffffffffffff18 = auVar10 << 8;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
          iVar22 = (int)((ulong)((long)(pCVar14->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar14->m_chain).vChain.
                                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
          active_tip2 = (CBlockIndex *)CONCAT44(active_tip2._4_4_,iVar22);
          local_498 = (CBlockIndex *)CONCAT44(local_498._4_4_,0x6e);
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar22 == 0x6e);
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip2;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013890c8;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_013890c8;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_130 = (undefined1  [8])&local_498;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf552c6,(size_t)&local_100,
                     100,&criticalblock19.super_unique_lock,"110",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          criticalblock19.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          auVar11[0xf] = 0;
          auVar11._0_15_ = stack0xffffffffffffff19;
          stack0xffffffffffffff18 = auVar11 << 8;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
          pCVar16 = ChainstateManager::ActiveChainstate(this_00);
          ppCVar3 = (pCVar16->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar3 ==
              (pCVar16->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pCVar21 = (CBlockIndex *)0x0;
          }
          else {
            pCVar21 = ppCVar3[-1];
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
          local_508 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_500 = "";
          local_518 = &boost::unit_test::basic_cstring<char_const>::null;
          local_510 = &boost::unit_test::basic_cstring<char_const>::null;
          file_18.m_end = (iterator)0x67;
          file_18.m_begin = (iterator)&local_508;
          msg_18.m_end = pvVar20;
          msg_18.m_begin = pvVar18;
          active_tip2 = pCVar21;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                     (size_t)&local_518,msg_18);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(active_tip == pCVar21->pprev);
          local_130 = (undefined1  [8])&pCVar21->pprev;
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389e10;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_01389e10;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf54e61,(size_t)&local_100,
                     0x67,&criticalblock19.super_unique_lock,"active_tip2->pprev",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          local_528 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_520 = "";
          local_538 = &boost::unit_test::basic_cstring<char_const>::null;
          local_530 = &boost::unit_test::basic_cstring<char_const>::null;
          file_19.m_end = &DAT_00000068;
          file_19.m_begin = (iterator)&local_528;
          msg_19.m_end = pvVar20;
          msg_19.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                     (size_t)&local_538,msg_19);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          ppCVar3 = (pCVar14->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar3 ==
              (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_498 = (CBlockIndex *)0x0;
          }
          else {
            local_498 = ppCVar3[-1];
          }
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(active_tip == local_498);
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389e10;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_01389e10;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x2;
          local_130 = (undefined1  [8])&local_498;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf54e61,(size_t)&local_100,
                     0x68,&criticalblock19.super_unique_lock,"c1.m_chain.Tip()",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          local_548 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
          ;
          local_540 = "";
          file_20.m_end = (iterator)0x69;
          file_20.m_begin = (iterator)&local_548;
          msg_20.m_end = pvVar20;
          msg_20.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                     (size_t)&stack0xfffffffffffffaa8,msg_20);
          local_168.m_message.px = (element_type *)(local_168.m_message._1_8_ << 8);
          local_168._0_8_ = &PTR__lazy_ostream_01388f08;
          local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_150 = "";
          ppCVar3 = (pCVar15->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar3 ==
              (pCVar15->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_498 = (CBlockIndex *)0x0;
          }
          else {
            local_498 = ppCVar3[-1];
          }
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)(pCVar21 == local_498);
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_100 = (element_type *)0xf54ac3;
          local_f8.pi_ = (sp_counted_base *)0xf54b3e;
          local_108 = (CChain *)&active_tip2;
          criticalblock19.super_unique_lock._8_8_ = criticalblock19._9_8_ << 8;
          criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01389e10;
          asStack_e0[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          asStack_e0[1].pi_ = (sp_counted_base *)&local_108;
          local_128.m_message.px = (element_type *)(local_128.m_message._1_8_ << 8);
          local_128._0_8_ = &PTR__lazy_ostream_01389e10;
          local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_110 = (assertion_result *)local_130;
          local_130 = (undefined1  [8])&local_498;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf5542a,(size_t)&local_100,
                     0x69,&criticalblock19.super_unique_lock,"c2.m_chain.Tip()",uVar25);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          ValidationSignals::SyncWithValidationInterfaceQueue
                    ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                     super_BasicTestingSetup.m_node.validation_signals._M_t.
                     super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                     .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
          if (all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(all2.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)all2.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)all2.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
              &_.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
            operator_delete(_.super_ValidationState<BlockValidationResult>.m_debug_message.
                            _M_dataplus._M_p,
                            CONCAT71(_.super_ValidationState<BlockValidationResult>.m_debug_message.
                                     field_2._M_allocated_capacity._1_7_,
                                     _.super_ValidationState<BlockValidationResult>.m_debug_message.
                                     field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
              &_.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
            operator_delete(_.super_ValidationState<BlockValidationResult>.m_reject_reason.
                            _M_dataplus._M_p,
                            _.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                            _M_allocated_capacity + 1);
          }
          if (all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(all.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)all.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)all.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(chainstates.
                            super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)chainstates.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)chainstates.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return;
          }
        }
        __stack_chk_fail();
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager, TestChain100Setup)
{
    ChainstateManager& manager = *m_node.chainman;
    std::vector<Chainstate*> chainstates;

    BOOST_CHECK(!manager.SnapshotBlockhash().has_value());

    // Create a legacy (IBD) chainstate.
    //
    Chainstate& c1 = manager.ActiveChainstate();
    chainstates.push_back(&c1);

    BOOST_CHECK(!manager.IsSnapshotActive());
    BOOST_CHECK(WITH_LOCK(::cs_main, return !manager.IsSnapshotValidated()));
    auto all = manager.GetAll();
    BOOST_CHECK_EQUAL_COLLECTIONS(all.begin(), all.end(), chainstates.begin(), chainstates.end());

    auto& active_chain = WITH_LOCK(manager.GetMutex(), return manager.ActiveChain());
    BOOST_CHECK_EQUAL(&active_chain, &c1.m_chain);

    // Get to a valid assumeutxo tip (per chainparams);
    mineBlocks(10);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 110);
    auto active_tip = WITH_LOCK(manager.GetMutex(), return manager.ActiveTip());
    auto exp_tip = c1.m_chain.Tip();
    BOOST_CHECK_EQUAL(active_tip, exp_tip);

    BOOST_CHECK(!manager.SnapshotBlockhash().has_value());

    // Create a snapshot-based chainstate.
    //
    const uint256 snapshot_blockhash = active_tip->GetBlockHash();
    Chainstate& c2 = WITH_LOCK(::cs_main, return manager.ActivateExistingSnapshot(snapshot_blockhash));
    chainstates.push_back(&c2);
    c2.InitCoinsDB(
        /*cache_size_bytes=*/1 << 23, /*in_memory=*/true, /*should_wipe=*/false);
    {
        LOCK(::cs_main);
        c2.InitCoinsCache(1 << 23);
        c2.CoinsTip().SetBestBlock(active_tip->GetBlockHash());
        c2.setBlockIndexCandidates.insert(manager.m_blockman.LookupBlockIndex(active_tip->GetBlockHash()));
        c2.LoadChainTip();
    }
    BlockValidationState _;
    BOOST_CHECK(c2.ActivateBestChain(_, nullptr));

    BOOST_CHECK_EQUAL(manager.SnapshotBlockhash().value(), snapshot_blockhash);
    BOOST_CHECK(manager.IsSnapshotActive());
    BOOST_CHECK(WITH_LOCK(::cs_main, return !manager.IsSnapshotValidated()));
    BOOST_CHECK_EQUAL(&c2, &manager.ActiveChainstate());
    BOOST_CHECK(&c1 != &manager.ActiveChainstate());
    auto all2 = manager.GetAll();
    BOOST_CHECK_EQUAL_COLLECTIONS(all2.begin(), all2.end(), chainstates.begin(), chainstates.end());

    auto& active_chain2 = WITH_LOCK(manager.GetMutex(), return manager.ActiveChain());
    BOOST_CHECK_EQUAL(&active_chain2, &c2.m_chain);

    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 110);
    mineBlocks(1);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 111);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return c1.m_chain.Height()), 110);

    auto active_tip2 = WITH_LOCK(manager.GetMutex(), return manager.ActiveTip());
    BOOST_CHECK_EQUAL(active_tip, active_tip2->pprev);
    BOOST_CHECK_EQUAL(active_tip, c1.m_chain.Tip());
    BOOST_CHECK_EQUAL(active_tip2, c2.m_chain.Tip());

    // Let scheduler events finish running to avoid accessing memory that is going to be unloaded
    m_node.validation_signals->SyncWithValidationInterfaceQueue();
}